

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.hpp
# Opt level: O0

void __thiscall
glu::TextureTestUtil::ReferenceParams::ReferenceParams
          (ReferenceParams *this,TextureType texType_,Sampler *sampler_,LodMode lodMode_)

{
  LodMode lodMode__local;
  Sampler *sampler__local;
  TextureType texType__local;
  ReferenceParams *this_local;
  
  RenderParams::RenderParams(&this->super_RenderParams,texType_);
  memcpy(&this->sampler,sampler_,0x3c);
  this->lodMode = lodMode_;
  this->minLod = -1000.0;
  this->maxLod = 1000.0;
  this->baseLevel = 0;
  this->maxLevel = 1000;
  return;
}

Assistant:

ReferenceParams (TextureType texType_, const tcu::Sampler& sampler_, LodMode lodMode_ = LODMODE_EXACT)
		: RenderParams	(texType_)
		, sampler		(sampler_)
		, lodMode		(lodMode_)
		, minLod		(-1000.0f)
		, maxLod		(1000.0f)
		, baseLevel		(0)
		, maxLevel		(1000)
	{
	}